

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack.cpp
# Opt level: O1

bool goodform::msgpack::deserialize(istream *input,any *v)

{
  int iVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *pmVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  mapped_type *pmVar8;
  long *plVar9;
  byte *pbVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  uint32_t sz_be;
  any key;
  allocator_type local_71;
  double local_70;
  undefined1 local_68 [8];
  _Storage _Stack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Storage *local_48;
  size_t sStack_40;
  ulong local_38;
  
  uVar4 = std::istream::get();
  bVar13 = *(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) == 0;
  if (!bVar13) {
    return bVar13;
  }
  uVar5 = uVar4 & 0xff;
  bVar2 = (byte)uVar4;
  if (uVar5 < 0x80) {
    local_68 = (undefined1  [8])(CONCAT71(local_68._1_7_,bVar2) & 0xffffffffffffff7f);
    std::any::operator=(v,local_68);
    return bVar13;
  }
  if (0xdf < uVar5) {
    local_68[0] = -(bVar2 & 0x1f);
    std::any::operator=(v,local_68);
    return bVar13;
  }
  if (uVar5 < 0x90) {
    local_58._8_8_ = &_Stack_60;
    local_58._M_allocated_capacity = 0;
    local_68 = (undefined1  [8])0x0;
    _Stack_60._M_ptr = (void *)0x0;
    sStack_40 = 0;
    local_48 = (_Storage *)local_58._8_8_;
    std::any::operator=(v,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                           *)local_68);
    uVar11 = (ulong)(uVar4 & 0xf);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                 *)local_68);
    if (uVar11 == 0) {
      return bVar13;
    }
    do {
      local_68 = (undefined1  [8])0x0;
      _Stack_60._M_ptr = (void *)0x0;
      bVar13 = deserialize(input,(any *)local_68);
      if ((bVar13) && (bVar13 = is<std::__cxx11::string>((any *)local_68), bVar13)) {
        pmVar6 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                           (v);
        pbVar7 = get<std::__cxx11::string>((any *)local_68);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                 ::operator[](pmVar6,pbVar7);
        bVar13 = deserialize(input,pmVar8);
      }
      else {
        bVar13 = false;
      }
      if (local_68 != (undefined1  [8])0x0) {
        (*(code *)local_68)(3,(any *)local_68,0);
      }
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    return bVar13;
  }
  if (uVar5 < 0xa0) {
    uVar4 = uVar4 & 0xf;
    std::vector<std::any,_std::allocator<std::any>_>::vector
              ((vector<std::any,_std::allocator<std::any>_> *)local_68,(ulong)uVar4,
               (allocator_type *)&local_70);
    if ((ulong)uVar4 != 0) {
      uVar11 = 0;
      do {
        deserialize(input,(any *)((long)local_68 + uVar11));
        uVar11 = uVar11 + 0x10;
      } while (uVar4 << 4 != uVar11);
    }
    std::any::operator=(v,(vector<std::any,_std::allocator<std::any>_> *)local_68);
    std::vector<std::any,_std::allocator<std::any>_>::~vector
              ((vector<std::any,_std::allocator<std::any>_> *)local_68);
    return bVar13;
  }
  if (uVar5 < 0xc0) {
    _Stack_60._M_ptr = (void *)0x0;
    local_58._M_allocated_capacity = local_58._M_allocated_capacity & 0xffffffffffffff00;
    local_68 = (undefined1  [8])&local_58;
    std::__cxx11::string::resize((ulong)local_68,bVar2 & 0x1f);
    std::istream::read((char *)input,(long)local_68);
    iVar1 = *(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20);
    if (iVar1 == 0) {
      std::any::operator=(v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68);
    }
    bVar13 = iVar1 == 0 && bVar13;
    if (local_68 == (undefined1  [8])&local_58) {
      return bVar13;
    }
    operator_delete((void *)local_68,(ulong)(local_58._M_allocated_capacity + 1));
    return bVar13;
  }
  bVar14 = false;
  switch(uVar4 & 0xff) {
  case 0xc0:
    local_68 = (undefined1  [8])0x0;
    std::any::operator=(v,(void **)local_68);
    bVar14 = bVar13;
    break;
  case 0xc2:
    local_68 = (undefined1  [8])((ulong)(uint7)local_68._1_7_ << 8);
    goto LAB_0012ef70;
  case 0xc3:
    local_68[0] = 1;
LAB_0012ef70:
    std::any::operator=(v,(bool *)local_68);
    bVar14 = bVar13;
    break;
  case 0xc4:
    bVar2 = std::istream::get();
    bVar14 = *(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) == 0;
    if (!bVar14) {
      return bVar14;
    }
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_68,(ulong)bVar2,
               (allocator_type *)&local_70);
    plVar9 = (long *)std::istream::read((char *)input,(long)local_68);
    if (*(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0) {
      std::any::operator=(v,(vector<char,_std::allocator<char>_> *)local_68);
    }
    else {
LAB_0012ef4b:
      bVar14 = false;
    }
    goto LAB_0012ef4d;
  case 0xc5:
    plVar9 = (long *)std::istream::read((char *)input,(long)&local_70);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (!bVar14) {
      return bVar14;
    }
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_68,
               (ulong)(ushort)(local_70._0_2_ << 8 | local_70._0_2_ >> 8),&local_71);
    plVar9 = (long *)std::istream::read((char *)input,(long)local_68);
    if (*(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) != 0) goto LAB_0012ef4b;
    std::any::operator=(v,(vector<char,_std::allocator<char>_> *)local_68);
    goto LAB_0012ef4d;
  case 0xc6:
    plVar9 = (long *)std::istream::read((char *)input,(long)&local_70);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (!bVar14) {
      return bVar14;
    }
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_68,
               (ulong)(local_70._0_4_ >> 0x18 | (local_70._0_4_ & 0xff0000) >> 8 |
                       (local_70._0_4_ & 0xff00) << 8 | local_70._0_4_ << 0x18),&local_71);
    plVar9 = (long *)std::istream::read((char *)input,(long)local_68);
    if (*(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) != 0) goto LAB_0012ef4b;
    std::any::operator=(v,(vector<char,_std::allocator<char>_> *)local_68);
LAB_0012ef4d:
    if (local_68 != (undefined1  [8])0x0) {
      pbVar10 = (byte *)(local_58._M_allocated_capacity - (long)local_68);
LAB_0012f346:
      operator_delete((void *)local_68,(ulong)pbVar10);
    }
    break;
  case 0xca:
    plVar9 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (bVar14) {
      local_70 = (double)CONCAT44(local_70._4_4_,
                                  (uint)local_68._0_4_ >> 0x18 | (local_68._0_4_ & 0xff0000) >> 8 |
                                  (local_68._0_4_ & 0xff00) << 8 | local_68._0_4_ << 0x18);
      std::any::operator=(v,(float *)&local_70);
    }
    break;
  case 0xcb:
    plVar9 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (bVar14) {
      local_70 = (double)((ulong)local_68 >> 0x38 | ((ulong)local_68 & 0xff000000000000) >> 0x28 |
                          ((ulong)local_68 & 0xff0000000000) >> 0x18 |
                          ((ulong)local_68 & 0xff00000000) >> 8 |
                          ((ulong)local_68 & 0xff000000) << 8 | ((ulong)local_68 & 0xff0000) << 0x18
                          | ((ulong)local_68 & 0xff00) << 0x28 | (long)local_68 << 0x38);
      std::any::operator=(v,&local_70);
    }
    break;
  case 0xcc:
    plVar9 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (bVar14) {
      std::any::operator=(v,local_68);
    }
    break;
  case 0xcd:
    plVar9 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (bVar14) {
      local_70 = (double)CONCAT62(local_70._2_6_,local_68._0_2_ << 8 | (ushort)local_68._0_2_ >> 8);
      std::any::operator=(v,(unsigned_short *)&local_70);
    }
    break;
  case 0xce:
    plVar9 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (bVar14) {
      local_70 = (double)CONCAT44(local_70._4_4_,
                                  (uint)local_68._0_4_ >> 0x18 | (local_68._0_4_ & 0xff0000) >> 8 |
                                  (local_68._0_4_ & 0xff00) << 8 | local_68._0_4_ << 0x18);
      std::any::operator=(v,(uint *)&local_70);
    }
    break;
  case 0xcf:
    plVar9 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (bVar14) {
      local_70 = (double)((ulong)local_68 >> 0x38 | ((ulong)local_68 & 0xff000000000000) >> 0x28 |
                          ((ulong)local_68 & 0xff0000000000) >> 0x18 |
                          ((ulong)local_68 & 0xff00000000) >> 8 |
                          ((ulong)local_68 & 0xff000000) << 8 | ((ulong)local_68 & 0xff0000) << 0x18
                          | ((ulong)local_68 & 0xff00) << 0x28 | (long)local_68 << 0x38);
      std::any::operator=(v,(unsigned_long *)&local_70);
    }
    break;
  case 0xd0:
    plVar9 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (bVar14) {
      std::any::operator=(v,local_68);
    }
    break;
  case 0xd1:
    plVar9 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (bVar14) {
      local_70 = (double)CONCAT62(local_70._2_6_,local_68._0_2_ << 8 | (ushort)local_68._0_2_ >> 8);
      std::any::operator=(v,(short *)&local_70);
    }
    break;
  case 0xd2:
    plVar9 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (bVar14) {
      local_70 = (double)CONCAT44(local_70._4_4_,
                                  (uint)local_68._0_4_ >> 0x18 | (local_68._0_4_ & 0xff0000) >> 8 |
                                  (local_68._0_4_ & 0xff00) << 8 | local_68._0_4_ << 0x18);
      std::any::operator=(v,(int *)&local_70);
    }
    break;
  case 0xd3:
    plVar9 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (bVar14) {
      local_70 = (double)((ulong)local_68 >> 0x38 | ((ulong)local_68 & 0xff000000000000) >> 0x28 |
                          ((ulong)local_68 & 0xff0000000000) >> 0x18 |
                          ((ulong)local_68 & 0xff00000000) >> 8 |
                          ((ulong)local_68 & 0xff000000) << 8 | ((ulong)local_68 & 0xff0000) << 0x18
                          | ((ulong)local_68 & 0xff00) << 0x28 | (long)local_68 << 0x38);
      std::any::operator=(v,(long *)&local_70);
    }
    break;
  case 0xd9:
    cVar3 = std::istream::get();
    bVar13 = *(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) == 0;
    if (!bVar13) {
      return bVar13;
    }
    _Stack_60._M_ptr =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_58._M_allocated_capacity = local_58._M_allocated_capacity & 0xffffffffffffff00;
    local_68 = (undefined1  [8])&local_58;
    std::__cxx11::string::resize((ulong)local_68,cVar3);
    plVar9 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (bVar14) {
      std::any::operator=(v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68);
    }
    bVar14 = bVar14 && bVar13;
    if (local_68 == (undefined1  [8])&local_58) {
      return bVar14;
    }
    goto LAB_0012f33e;
  case 0xda:
    plVar9 = (long *)std::istream::read((char *)input,(long)&local_70);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (!bVar14) {
      return bVar14;
    }
    local_68 = (undefined1  [8])&local_58;
    _Stack_60._M_ptr =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_58._M_allocated_capacity = local_58._M_allocated_capacity & 0xffffffffffffff00;
    std::__cxx11::string::resize((ulong)local_68,(char)((ulong)local_70 >> 8));
    plVar9 = (long *)std::istream::read((char *)input,(long)local_68);
    if (*(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0) {
      std::any::operator=(v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68);
    }
    else {
LAB_0012f184:
      bVar14 = false;
    }
    goto LAB_0012f314;
  case 0xdb:
    plVar9 = (long *)std::istream::read((char *)input,(long)&local_70);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (!bVar14) {
      return bVar14;
    }
    local_68 = (undefined1  [8])&local_58;
    _Stack_60._M_ptr =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_58._M_allocated_capacity = local_58._M_allocated_capacity & 0xffffffffffffff00;
    std::__cxx11::string::resize((ulong)local_68,(char)((ulong)local_70 >> 0x18));
    plVar9 = (long *)std::istream::read((char *)input,(long)local_68);
    if (*(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) != 0) goto LAB_0012f184;
    std::any::operator=(v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_68);
LAB_0012f314:
    if (local_68 == (undefined1  [8])&local_58) {
      return bVar14;
    }
LAB_0012f33e:
    pbVar10 = (byte *)(local_58._M_allocated_capacity + 1);
    goto LAB_0012f346;
  case 0xdc:
    plVar9 = (long *)std::istream::read((char *)input,(long)&local_70);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (!bVar14) {
      return bVar14;
    }
    std::vector<std::any,_std::allocator<std::any>_>::vector
              ((vector<std::any,_std::allocator<std::any>_> *)local_68,
               (ulong)(ushort)(local_70._0_2_ << 8 | local_70._0_2_ >> 8),
               (allocator_type *)&local_71);
    if ((undefined1  [8])_Stack_60._M_ptr != local_68) {
      lVar12 = 0;
      uVar11 = 0;
      do {
        bVar14 = deserialize(input,(any *)((long)local_68 + lVar12));
        if (!bVar14) break;
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x10;
      } while (uVar11 < (ulong)((long)_Stack_60._M_ptr - (long)local_68 >> 4));
    }
    std::any::operator=(v,(vector<std::any,_std::allocator<std::any>_> *)local_68);
    goto LAB_0012f250;
  case 0xdd:
    plVar9 = (long *)std::istream::read((char *)input,(long)&local_70);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (!bVar14) {
      return bVar14;
    }
    std::vector<std::any,_std::allocator<std::any>_>::vector
              ((vector<std::any,_std::allocator<std::any>_> *)local_68,
               (ulong)(local_70._0_4_ >> 0x18 | (local_70._0_4_ & 0xff0000) >> 8 |
                       (local_70._0_4_ & 0xff00) << 8 | local_70._0_4_ << 0x18),
               (allocator_type *)&local_71);
    if ((undefined1  [8])_Stack_60._M_ptr != local_68) {
      lVar12 = 0;
      uVar11 = 0;
      do {
        bVar14 = deserialize(input,(any *)((long)local_68 + lVar12));
        if (!bVar14) break;
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x10;
      } while (uVar11 < (ulong)((long)_Stack_60._M_ptr - (long)local_68 >> 4));
    }
    std::any::operator=(v,(vector<std::any,_std::allocator<std::any>_> *)local_68);
LAB_0012f250:
    std::vector<std::any,_std::allocator<std::any>_>::~vector
              ((vector<std::any,_std::allocator<std::any>_> *)local_68);
    break;
  case 0xde:
    plVar9 = (long *)std::istream::read((char *)input,(long)&local_70);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (bVar14) {
      local_58._8_8_ = &_Stack_60;
      local_58._M_allocated_capacity = 0;
      local_68 = (undefined1  [8])0x0;
      _Stack_60._M_ptr = (void *)0x0;
      sStack_40 = 0;
      local_48 = (_Storage *)local_58._8_8_;
      std::any::operator=(v,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                             *)local_68);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                   *)local_68);
      if (local_70._0_2_ != 0) {
        local_38 = (ulong)(ushort)(local_70._0_2_ << 8 | local_70._0_2_ >> 8);
        uVar11 = 1;
        do {
          local_68 = (undefined1  [8])0x0;
          _Stack_60._M_ptr = (void *)0x0;
          bVar13 = deserialize(input,(any *)local_68);
          if ((bVar13) && (bVar13 = is<std::__cxx11::string>((any *)local_68), bVar13)) {
            pmVar6 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                               (v);
            pbVar7 = get<std::__cxx11::string>((any *)local_68);
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                     ::operator[](pmVar6,pbVar7);
            bVar14 = deserialize(input,pmVar8);
          }
          else {
            bVar14 = false;
          }
          std::any::~any((any *)local_68);
        } while ((bVar14 != false) && (bVar13 = uVar11 < local_38, uVar11 = uVar11 + 1, bVar13));
      }
    }
    break;
  case 0xdf:
    plVar9 = (long *)std::istream::read((char *)input,(long)&local_70);
    bVar14 = *(int *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) == 0;
    if (bVar14) {
      local_58._8_8_ = &_Stack_60;
      local_58._M_allocated_capacity = 0;
      local_68 = (undefined1  [8])0x0;
      _Stack_60._M_ptr = (void *)0x0;
      sStack_40 = 0;
      local_48 = (_Storage *)local_58._8_8_;
      std::any::operator=(v,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                             *)local_68);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                   *)local_68);
      if (local_70._0_4_ != 0) {
        local_38 = (ulong)(local_70._0_4_ >> 0x18 | (local_70._0_4_ & 0xff0000) >> 8 |
                           (local_70._0_4_ & 0xff00) << 8 | local_70._0_4_ << 0x18);
        uVar11 = 1;
        do {
          local_68 = (undefined1  [8])0x0;
          _Stack_60._M_ptr = (void *)0x0;
          bVar13 = deserialize(input,(any *)local_68);
          if ((bVar13) && (bVar13 = is<std::__cxx11::string>((any *)local_68), bVar13)) {
            pmVar6 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                               (v);
            pbVar7 = get<std::__cxx11::string>((any *)local_68);
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                     ::operator[](pmVar6,pbVar7);
            bVar14 = deserialize(input,pmVar8);
          }
          else {
            bVar14 = false;
          }
          std::any::~any((any *)local_68);
        } while ((bVar14 != false) && (bVar13 = uVar11 < local_38, uVar11 = uVar11 + 1, bVar13));
      }
    }
  }
  return bVar14;
}

Assistant:

bool msgpack::deserialize(std::istream& input, any& v)
  {
    unsigned int typeByte = static_cast<unsigned int>(0xFF & input.get());
    bool ret = input.good();
    if (ret)
    {
      if (/*typeByte >= 0x00 &&*/ typeByte <= 0x7F) // positive fixint 0xxxxxxx
      {
        v = std::uint8_t(0x7F & typeByte);
      }
      else if (typeByte >= 0xE0 && typeByte <= 0xFF) // negative fixint	111xxxxx
      {
        v = std::int8_t((0x1F & typeByte ) * -1);
      }
      else if (typeByte >= 0x80 && typeByte <= 0x8F) // fixmap	1000xxxx
      {
        std::size_t sz(0x0F & typeByte);
        v = goodform::object_t();
        for (size_t i = 0; i < sz; ++i)
        {
          any key;
          if (!msgpack::deserialize(input, key) || !is<std::string>(key)) // Only supporting string keys.
            ret = false;
          else
            ret = msgpack::deserialize(input, get<object_t>(v)[get<std::string>(key)]);
        }
      }
      else if (typeByte >= 0x90 && typeByte <= 0x9F) // fixarray	1001xxxx
      {
        std::size_t sz(0x0F & typeByte);
        goodform::array_t a(sz);
        for (size_t i = 0; i < sz; ++i)
          msgpack::deserialize(input, a[i]);
        v = std::move(a);
      }
      else if (typeByte >= 0xA0 && typeByte <= 0xBF) // fixstr	101xxxxx
      {
        std::size_t sz(0x1F & typeByte);
        std::string s;
        s.resize(sz);
        input.read(&s[0], sz);
        if (!input.good())
          ret = false;
        else
          v = std::move(s);
      }
      else if (typeByte == 0xC0) // null
      {
        v = nullptr;
      }
      else if (typeByte == 0xC2) // false
      {
        v = false;
      }
      else if (typeByte == 0xC3) // true
      {
        v = true;
      }
      else if (typeByte == 0xC4) // Bin 8
      {
        std::size_t sz (0xFF & static_cast<unsigned int>(input.get()));
        ret = input.good();
        if (ret)
        {
          goodform::binary_t b(sz);
          if (!input.read(b.data(), sz).good())
            ret = false;
          else
            v = std::move(b);
        }
      }
      else if (typeByte == 0xC5) // Bin 16
      {
        std::uint16_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          goodform::binary_t b(be16toh(sz_be));
          if (!input.read(b.data(), b.size()).good())
            ret = false;
          else
            v = std::move(b);
        }
      }
      else if (typeByte == 0xC6) // Bin 32
      {
        std::uint32_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          goodform::binary_t b(be32toh(sz_be));
          if (!input.read(b.data(), b.size()).good())
            ret = false;
          else
            v = std::move(b);
        }
      }
      else if (typeByte == 0xCA) // Float 32
      {
        std::uint32_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          numeric_union32 u;
          u.i = be32toh(be);
          v = u.f;
        }
      }
      else if (typeByte == 0xCB) // Float 64
      {
        std::uint64_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          numeric_union64 u;
          u.i = be64toh(be);
          v = u.f;
        }
      }
      else if (typeByte == 0xCC) // Uint 8
      {
        std::uint8_t val;
        ret = input.read((char*)&val, sizeof(val)).good();
        if (ret)
          v = val;
      }
      else if (typeByte == 0xCD) // Uint 16
      {
        std::uint16_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::uint16_t val(be16toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xCE) // Uint 32
      {
        std::uint32_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::uint32_t val(be32toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xCF) // Uint 64
      {
        std::uint64_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::uint64_t val(be64toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xD0) // Int 8
      {
        std::int8_t val;
        ret = input.read((char*)&val, sizeof(val)).good();
        if (ret)
          v = val;
      }
      else if (typeByte == 0xD1) // Int 16
      {
        std::int16_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::int16_t val(be16toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xD2) // Int 32
      {
        std::int32_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::int32_t val(be32toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xD3) // Int 64
      {
        std::int64_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::int64_t val(be64toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xD9) // str 8
      {
        std::size_t sz(0xFF & static_cast<unsigned int>(input.get()));
        ret = input.good();
        if (ret)
        {
          std::string s;
          s.resize(sz);
          if (!input.read(&s[0], sz).good())
            ret = false;
          else
            v = std::move(s);
        }
      }
      else if (typeByte == 0xDA) // str 16
      {
        std::uint16_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          std::string s;
          s.resize(be16toh(sz_be));
          if (!input.read(&s[0], s.size()).good())
            ret = false;
          else
            v = std::move(s);
        }
      }
      else if (typeByte == 0xDB) // str 32
      {
        std::uint32_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          std::string s;
          s.resize(be32toh(sz_be));
          if (!input.read(&s[0], s.size()).good())
            ret = false;
          else
            v = std::move(s);
        }
      }
      else if (typeByte == 0xDC) // array 16
      {
        std::uint16_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          goodform::array_t a(be16toh(sz_be));
          for (size_t i = 0; ret && i < a.size(); ++i)
            ret = msgpack::deserialize(input, a[i]);
          v = std::move(a);
        }
      }
      else if (typeByte == 0xDD) // array 32
      {
        std::uint32_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          goodform::array_t a(be32toh(sz_be));
          for (size_t i = 0; ret && i < a.size(); ++i)
            ret = msgpack::deserialize(input, a[i]);
          v = std::move(a);
        }
      }
      else if (typeByte == 0xDE) // map 16
      {
        std::uint16_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          v = object_t();
          std::uint16_t sz(be16toh(sz_be));
          for (size_t i = 0; ret && i < sz; ++i)
          {
            any key;
            if (!msgpack::deserialize(input, key) || !is<std::string>(key)) // Only supporting string keys.
              ret = false;
            else
              ret = msgpack::deserialize(input, get<object_t>(v)[get<std::string>(key)]);
          }
        }
      }
      else if (typeByte == 0xDF) // map 32
      {
        std::uint32_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          v = object_t();
          std::uint32_t sz(be32toh(sz_be));
          for (size_t i = 0; ret && i < sz; ++i)
          {
            any key;
            if (!msgpack::deserialize(input, key) || !is<std::string>(key)) // Only supporting string keys.
              ret = false;
            else
              ret = msgpack::deserialize(input, get<object_t>(v)[get<std::string>(key)]);
          }
        }
      }
      else // Not Supported
      {
        ret = false;
      }
    }

    return ret;
  }